

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_query.c
# Opt level: O3

int dwarf_cu_header_basics
              (Dwarf_Die die,Dwarf_Half *version,Dwarf_Bool *is_info,Dwarf_Bool *is_dwo,
              Dwarf_Half *offset_size,Dwarf_Half *address_size,Dwarf_Half *extension_size,
              Dwarf_Sig8 **signature,Dwarf_Off *offset_of_length,Dwarf_Unsigned *total_byte_length,
              Dwarf_Error *error)

{
  Dwarf_CU_Context_conflict pDVar1;
  Dwarf_Sig8 *pDVar2;
  Dwarf_Signed errval;
  
  if (die == (Dwarf_Die)0x0) {
    errval = 0x34;
  }
  else {
    pDVar1 = die->di_cu_context;
    if (pDVar1 != (Dwarf_CU_Context_conflict)0x0) {
      if ((pDVar1->cc_dbg == (Dwarf_Debug)0x0) || (pDVar1->cc_dbg->de_magic != 0xebfdebfd)) {
        _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                            "DW_DLE_DBG_NULL: accesing a cu context, Dwarf_Debug either null or it containsa stale Dwarf_Debug pointer"
                           );
        return 1;
      }
      if (version != (Dwarf_Half *)0x0) {
        *version = pDVar1->cc_version_stamp;
      }
      if (is_info != (Dwarf_Bool *)0x0) {
        *is_info = die->di_is_info;
      }
      if (is_dwo != (Dwarf_Bool *)0x0) {
        *is_dwo = pDVar1->cc_is_dwo;
      }
      if (offset_size != (Dwarf_Half *)0x0) {
        *offset_size = (ushort)pDVar1->cc_length_size;
      }
      if (address_size != (Dwarf_Half *)0x0) {
        *address_size = (ushort)pDVar1->cc_address_size;
      }
      if (extension_size != (Dwarf_Half *)0x0) {
        *extension_size = (ushort)pDVar1->cc_extension_size;
      }
      if (signature != (Dwarf_Sig8 **)0x0) {
        pDVar2 = (Dwarf_Sig8 *)0x0;
        if (pDVar1->cc_signature_present != 0) {
          pDVar2 = &pDVar1->cc_signature;
        }
        *signature = pDVar2;
      }
      if (offset_of_length != (Dwarf_Off *)0x0) {
        *offset_of_length = pDVar1->cc_debug_offset;
      }
      if (total_byte_length != (Dwarf_Unsigned *)0x0) {
        *total_byte_length =
             (ulong)pDVar1->cc_extension_size + (ulong)pDVar1->cc_length_size + pDVar1->cc_length;
        return 0;
      }
      return 0;
    }
    errval = 0x68;
  }
  _dwarf_error((Dwarf_Debug)0x0,error,errval);
  return 1;
}

Assistant:

int
dwarf_cu_header_basics(Dwarf_Die die,
    Dwarf_Half *version,
    Dwarf_Bool *is_info,
    Dwarf_Bool *is_dwo,
    Dwarf_Half *offset_size,
    Dwarf_Half *address_size,
    Dwarf_Half *extension_size,
    Dwarf_Sig8 **signature,
    Dwarf_Off  *offset_of_length,
    Dwarf_Unsigned  *total_byte_length,
    Dwarf_Error *error)
{
    Dwarf_CU_Context context = 0;
    CHECK_DIE(die, DW_DLV_ERROR);

    context= die->di_cu_context;
    if (version) {
        *version = context->cc_version_stamp;
    }
    if (is_info) {
        /*  ASSERT: matches context->cc_is_info */
        *is_info = die->di_is_info;
    }
    if (is_dwo) {
        *is_dwo = context->cc_is_dwo;
    }
    if (offset_size) {
        *offset_size = context->cc_length_size;
    }
    if (address_size) {
        *address_size = context->cc_address_size;
    }
    if (extension_size) {
        *extension_size = context->cc_extension_size;
    }
    if (signature) {
        if (context->cc_signature_present) {
            *signature =  &context->cc_signature;
        } else {
            *signature = 0;
        }
    }
    if (offset_of_length) {
        *offset_of_length = context->cc_debug_offset;
    }
    if (total_byte_length) {
        *total_byte_length = context->cc_length +
            context->cc_length_size + context->cc_extension_size;
    }
    return DW_DLV_OK;
}